

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall
nnad::Matrix<double>::Matrix
          (Matrix<double> *this,Matrix<double> *x,function<double_(const_double_&)> *f)

{
  int iVar1;
  allocator_type *__n;
  vector<double,_std::allocator<double>_> *this_00;
  size_type sVar2;
  reference pvVar3;
  Matrix<double> *in_RSI;
  allocator_type *in_RDI;
  int i;
  vector<double,_std::allocator<double>_> xv;
  Matrix<double> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int local_4c;
  vector<double,_std::allocator<double>_> local_48 [2];
  Matrix<double> *local_10;
  
  local_10 = in_RSI;
  iVar1 = GetLines(in_RSI);
  *(int *)in_RDI = iVar1;
  iVar1 = GetColumns(local_10);
  *(int *)(in_RDI + 4) = iVar1;
  __n = in_RDI + 8;
  this_00 = (vector<double,_std::allocator<double>_> *)(long)(*(int *)in_RDI * *(int *)(in_RDI + 4))
  ;
  std::allocator<double>::allocator((allocator<double> *)0x111b4a);
  std::vector<double,_std::allocator<double>_>::vector(this_00,(size_type)__n,in_RDI);
  std::allocator<double>::~allocator((allocator<double> *)0x111b6a);
  GetVector(in_stack_ffffffffffffff78);
  local_4c = 0;
  while( true ) {
    iVar1 = local_4c;
    sVar2 = std::vector<double,_std::allocator<double>_>::size(local_48);
    if ((int)sVar2 <= iVar1) break;
    std::vector<double,_std::allocator<double>_>::operator[](local_48,(long)local_4c);
    in_stack_ffffffffffffff78 =
         (Matrix<double> *)
         std::function<double_(const_double_&)>::operator()
                   ((function<double_(const_double_&)> *)CONCAT44(iVar1,in_stack_ffffffffffffff80),
                    (double *)in_stack_ffffffffffffff78);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)local_4c);
    *pvVar3 = (value_type)in_stack_ffffffffffffff78;
    local_4c = local_4c + 1;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_RDI);
  return;
}

Assistant:

Matrix(Matrix const& x, std::function<T(T const&)> f):
      _Lines(x.GetLines()),
      _Columns(x.GetColumns()),
      _Matrix(_Lines * _Columns)
    {
      const std::vector<T> xv = x.GetVector();
      for (int i = 0; i < (int) xv.size(); i++)
        _Matrix[i] = f(xv[i]);
    }